

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O2

void __thiscall
ExchangePaths_RoundTripForTwoPaths_Test::~ExchangePaths_RoundTripForTwoPaths_Test
          (ExchangePaths_RoundTripForTwoPaths_Test *this)

{
  anon_unknown.dwarf_3015a9::ExchangePaths::~ExchangePaths(&this->super_ExchangePaths);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (ExchangePaths, RoundTripForTwoPaths) {
    // The output from the export phase.
    static constexpr auto comments = false;
    pstore::exchange::export_ns::ostringstream exported_names_stream;

    // The export phase. We put two strings into the paths index and export it.
    {
        std::array<pstore::gsl::czstring, 2> paths{{"path1", "path2"}};
        std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>>
            indir_strings;
        add_export_strings<pstore::trailer::indices::path> (
            export_db_, std::begin (paths), std::end (paths),
            std::inserter (indir_strings, std::end (indir_strings)));

        // Write the paths that we just created as JSON.
        pstore::exchange::export_ns::string_mapping exported_names{
            export_db_, pstore::exchange::export_ns::path_index_tag ()};
        pstore::exchange::export_ns::emit_strings<pstore::trailer::indices::path> (
            exported_names_stream, pstore::exchange::export_ns::indent{}, export_db_,
            export_db_.get_current_revision (), "", &exported_names, comments);
    }

    // The output from the import phase: the mapping from path index to address.
    pstore::exchange::import_ns::string_mapping imported_names;

    // The import phase. Read the JSON produced by the export phase and populate a database
    // accordingly.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            auto name_parser = import_strings_parser (&transaction, &imported_names);
            name_parser.input (exported_names_stream.str ()).eof ();
            ASSERT_FALSE (name_parser.has_error ())
                << "JSON error was: " << name_parser.last_error ().message () << ' '
                << name_parser.coordinate () << '\n'
                << exported_names_stream.str ();
        }
        transaction.commit ();
    }

    // Now verify the result of the import phase.
    std::list<std::string> out;
    ASSERT_EQ (imported_names.size (), 2U);

    {
        auto const str_addr_or_err = imported_names.lookup (0U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }
    {
        auto const str_addr_or_err = imported_names.lookup (1U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }

    EXPECT_THAT (out, testing::UnorderedElementsAre ("path1", "path2"));
    EXPECT_EQ (imported_names.lookup (2U), pstore::exchange::import_ns::error::no_such_name);
}